

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_v_predictor_32x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  ushort uVar13;
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  unkuint9 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  unkuint9 Var20;
  undefined1 auVar21 [11];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  uint uVar26;
  uint8_t *puVar27;
  short sVar28;
  short sVar30;
  undefined1 auVar29 [16];
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  ushort uVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  undefined1 auVar54 [16];
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar62;
  short sVar63;
  short sVar66;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  short sVar91;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  undefined1 auVar92 [16];
  short sVar100;
  undefined1 auVar93 [16];
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  
  auVar93 = _DAT_00516aa0;
  auVar29 = pshuflw(ZEXT116(left_column[0x1f]),ZEXT116(left_column[0x1f]),0);
  auVar55 = *(undefined1 (*) [16])top_row;
  auVar65 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar55._0_13_;
  auVar2[0xe] = auVar55[7];
  auVar4[0xc] = auVar55[6];
  auVar4._0_12_ = auVar55._0_12_;
  auVar4._13_2_ = auVar2._13_2_;
  auVar6[0xb] = 0;
  auVar6._0_11_ = auVar55._0_11_;
  auVar6._12_3_ = auVar4._12_3_;
  auVar8[10] = auVar55[5];
  auVar8._0_10_ = auVar55._0_10_;
  auVar8._11_4_ = auVar6._11_4_;
  auVar10[9] = 0;
  auVar10._0_9_ = auVar55._0_9_;
  auVar10._10_5_ = auVar8._10_5_;
  auVar12[8] = auVar55[4];
  auVar12._0_8_ = auVar55._0_8_;
  auVar12._9_6_ = auVar10._9_6_;
  auVar15._7_8_ = 0;
  auVar15._0_7_ = auVar12._8_7_;
  Var16 = CONCAT81(SUB158(auVar15 << 0x40,7),auVar55[3]);
  auVar22._9_6_ = 0;
  auVar22._0_9_ = Var16;
  auVar17._1_10_ = SUB1510(auVar22 << 0x30,5);
  auVar17[0] = auVar55[2];
  auVar23._11_4_ = 0;
  auVar23._0_11_ = auVar17;
  auVar18._1_12_ = SUB1512(auVar23 << 0x20,3);
  auVar18[0] = auVar55[1];
  uVar40 = (ushort)auVar55[0];
  uVar31 = (ushort)auVar55[8];
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar65._0_13_;
  auVar1[0xe] = auVar65[7];
  auVar3[0xc] = auVar65[6];
  auVar3._0_12_ = auVar65._0_12_;
  auVar3._13_2_ = auVar1._13_2_;
  auVar5[0xb] = 0;
  auVar5._0_11_ = auVar65._0_11_;
  auVar5._12_3_ = auVar3._12_3_;
  auVar7[10] = auVar65[5];
  auVar7._0_10_ = auVar65._0_10_;
  auVar7._11_4_ = auVar5._11_4_;
  auVar9[9] = 0;
  auVar9._0_9_ = auVar65._0_9_;
  auVar9._10_5_ = auVar7._10_5_;
  auVar11[8] = auVar65[4];
  auVar11._0_8_ = auVar65._0_8_;
  auVar11._9_6_ = auVar9._9_6_;
  auVar19._7_8_ = 0;
  auVar19._0_7_ = auVar11._8_7_;
  Var20 = CONCAT81(SUB158(auVar19 << 0x40,7),auVar65[3]);
  auVar24._9_6_ = 0;
  auVar24._0_9_ = Var20;
  auVar21._1_10_ = SUB1510(auVar24 << 0x30,5);
  auVar21[0] = auVar65[2];
  auVar25._11_4_ = 0;
  auVar25._0_11_ = auVar21;
  auVar14[2] = auVar65[1];
  auVar14._0_2_ = auVar65._0_2_;
  auVar14._3_12_ = SUB1512(auVar25 << 0x20,3);
  uVar47 = auVar65._0_2_ & 0xff;
  uVar39 = (ushort)auVar65[8];
  sVar28 = auVar29._0_2_;
  sVar30 = auVar29._2_2_;
  auVar54._2_2_ = sVar30 * 0x10;
  auVar54._0_2_ = sVar28;
  auVar54._4_2_ = sVar28 * 0x1f;
  auVar54._6_2_ = sVar30 * 0x2e;
  auVar54._8_2_ = sVar28 * 0x3c;
  auVar54._10_2_ = sVar30 * 0x4a;
  auVar54._12_2_ = sVar28 * 0x57;
  auVar54._14_2_ = sVar30 * 99;
  auVar29._0_2_ = sVar28 * 0xbe;
  auVar29._2_2_ = sVar30 * 0xc5;
  auVar29._4_2_ = sVar28 * 0xcc;
  auVar29._6_2_ = sVar30 * 0xd3;
  auVar29._8_2_ = sVar28 * 0xd9;
  auVar29._10_2_ = sVar30 * 0xde;
  auVar29._12_2_ = sVar28 * 0xe3;
  auVar29._14_2_ = sVar30 * 0xe7;
  puVar27 = dst + 0x10;
  uVar26 = 0xfefdfefe;
  do {
    uVar26 = uVar26 + 0x2020202;
    auVar92._4_4_ = uVar26;
    auVar92._0_4_ = uVar26;
    auVar92._8_4_ = uVar26;
    auVar92._12_4_ = uVar26;
    auVar64 = pshufb(auVar93,auVar92);
    auVar92 = pshufb(auVar54,auVar92);
    sVar57 = auVar64._0_2_;
    sVar41 = auVar18._0_2_;
    sVar58 = auVar64._2_2_;
    sVar42 = auVar17._0_2_;
    sVar59 = auVar64._4_2_;
    sVar43 = (short)Var16;
    sVar60 = auVar64._6_2_;
    sVar44 = auVar12._8_2_;
    sVar61 = auVar64._8_2_;
    sVar45 = auVar8._10_2_;
    sVar62 = auVar64._10_2_;
    sVar46 = auVar4._12_2_;
    sVar63 = auVar64._12_2_;
    sVar66 = auVar64._14_2_;
    uVar13 = auVar2._13_2_ >> 8;
    uVar32 = (ushort)auVar55[9];
    uVar33 = (ushort)auVar55[10];
    uVar34 = (ushort)auVar55[0xb];
    uVar35 = (ushort)auVar55[0xc];
    uVar36 = (ushort)auVar55[0xd];
    uVar37 = (ushort)auVar55[0xe];
    uVar38 = (ushort)auVar55[0xf];
    sVar91 = auVar92._0_2_ + 0x80;
    sVar94 = auVar92._2_2_ + 0x80;
    sVar95 = auVar92._4_2_ + 0x80;
    sVar96 = auVar92._6_2_ + 0x80;
    sVar97 = auVar92._8_2_ + 0x80;
    sVar98 = auVar92._10_2_ + 0x80;
    sVar99 = auVar92._12_2_ + 0x80;
    sVar100 = auVar92._14_2_ + 0x80;
    uVar67 = sVar57 * uVar40 + sVar91;
    uVar69 = sVar58 * sVar41 + sVar94;
    uVar71 = sVar59 * sVar42 + sVar95;
    uVar73 = sVar60 * sVar43 + sVar96;
    uVar75 = sVar61 * sVar44 + sVar97;
    uVar79 = sVar62 * sVar45 + sVar98;
    uVar83 = sVar63 * sVar46 + sVar99;
    uVar87 = sVar66 * uVar13 + sVar100;
    uVar68 = uVar67 >> 8;
    uVar70 = uVar69 >> 8;
    uVar72 = uVar71 >> 8;
    uVar74 = uVar73 >> 8;
    uVar76 = uVar75 >> 8;
    uVar80 = uVar79 >> 8;
    uVar84 = uVar83 >> 8;
    uVar88 = uVar87 >> 8;
    uVar101 = sVar57 * uVar31 + sVar91;
    uVar103 = sVar58 * uVar32 + sVar94;
    uVar105 = sVar59 * uVar33 + sVar95;
    uVar107 = sVar60 * uVar34 + sVar96;
    uVar109 = sVar61 * uVar35 + sVar97;
    uVar111 = sVar62 * uVar36 + sVar98;
    uVar113 = sVar63 * uVar37 + sVar99;
    uVar115 = sVar66 * uVar38 + sVar100;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    puVar27[-0x10] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
    puVar27[-0xf] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
    puVar27[-0xe] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    puVar27[-0xd] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    puVar27[-0xc] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar27[-0xb] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    puVar27[-10] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar27[-9] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar27[-8] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar27[-7] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar27[-6] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar27[-5] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar27[-4] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar27[-3] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar27[-2] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar27[-1] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    sVar48 = auVar14._2_2_;
    sVar49 = auVar21._0_2_;
    sVar50 = (short)Var20;
    sVar51 = auVar11._8_2_;
    sVar52 = auVar7._10_2_;
    sVar53 = auVar3._12_2_;
    uVar67 = auVar1._13_2_ >> 8;
    uVar68 = (ushort)auVar65[9];
    uVar69 = (ushort)auVar65[10];
    uVar70 = (ushort)auVar65[0xb];
    uVar71 = (ushort)auVar65[0xc];
    uVar72 = (ushort)auVar65[0xd];
    uVar73 = (ushort)auVar65[0xe];
    uVar74 = (ushort)auVar65[0xf];
    uVar109 = sVar57 * uVar47 + sVar91;
    uVar111 = sVar58 * sVar48 + sVar94;
    uVar113 = sVar59 * sVar49 + sVar95;
    uVar115 = sVar60 * sVar50 + sVar96;
    uVar77 = sVar61 * sVar51 + sVar97;
    uVar81 = sVar62 * sVar52 + sVar98;
    uVar85 = sVar63 * sVar53 + sVar99;
    uVar89 = sVar66 * uVar67 + sVar100;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar78 = uVar77 >> 8;
    uVar82 = uVar81 >> 8;
    uVar86 = uVar85 >> 8;
    uVar90 = uVar89 >> 8;
    uVar75 = sVar57 * uVar39 + sVar91;
    uVar79 = sVar58 * uVar68 + sVar94;
    uVar83 = sVar59 * uVar69 + sVar95;
    uVar87 = sVar60 * uVar70 + sVar96;
    uVar101 = sVar61 * uVar71 + sVar97;
    uVar103 = sVar62 * uVar72 + sVar98;
    uVar105 = sVar63 * uVar73 + sVar99;
    uVar107 = sVar66 * uVar74 + sVar100;
    uVar76 = uVar75 >> 8;
    uVar80 = uVar79 >> 8;
    uVar84 = uVar83 >> 8;
    uVar88 = uVar87 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    *puVar27 = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar27[1] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar27[2] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar27[3] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar27[4] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar27[5] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
    puVar27[6] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar27[7] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    puVar27[8] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar27[9] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    puVar27[10] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar27[0xb] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar27[0xc] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar27[0xd] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar27[0xe] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar27[0xf] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    auVar64 = _DAT_00516ac0;
    puVar27 = puVar27 + stride;
  } while (uVar26 < 0xd0c0d0d);
  auVar55._0_2_ = sVar28 * 0x6f;
  auVar55._2_2_ = sVar30 * 0x7b;
  auVar55._4_2_ = sVar28 * 0x86;
  auVar55._6_2_ = sVar30 * 0x91;
  auVar55._8_2_ = sVar28 * 0x9b;
  auVar55._10_2_ = sVar30 * 0xa4;
  auVar55._12_2_ = sVar28 * 0xad;
  auVar55._14_2_ = sVar30 * 0xb6;
  uVar26 = 0xfefdfefe;
  do {
    uVar26 = uVar26 + 0x2020202;
    auVar93._4_4_ = uVar26;
    auVar93._0_4_ = uVar26;
    auVar93._8_4_ = uVar26;
    auVar93._12_4_ = uVar26;
    auVar65 = pshufb(auVar64,auVar93);
    auVar93 = pshufb(auVar55,auVar93);
    sVar57 = auVar65._0_2_;
    sVar58 = auVar65._2_2_;
    sVar59 = auVar65._4_2_;
    sVar60 = auVar65._6_2_;
    sVar61 = auVar65._8_2_;
    sVar62 = auVar65._10_2_;
    sVar63 = auVar65._12_2_;
    sVar66 = auVar65._14_2_;
    sVar91 = auVar93._0_2_ + 0x80;
    sVar94 = auVar93._2_2_ + 0x80;
    sVar95 = auVar93._4_2_ + 0x80;
    sVar96 = auVar93._6_2_ + 0x80;
    sVar97 = auVar93._8_2_ + 0x80;
    sVar98 = auVar93._10_2_ + 0x80;
    sVar99 = auVar93._12_2_ + 0x80;
    sVar100 = auVar93._14_2_ + 0x80;
    uVar75 = sVar57 * uVar40 + sVar91;
    uVar79 = sVar58 * sVar41 + sVar94;
    uVar83 = sVar59 * sVar42 + sVar95;
    uVar87 = sVar60 * sVar43 + sVar96;
    uVar101 = sVar61 * sVar44 + sVar97;
    uVar103 = sVar62 * sVar45 + sVar98;
    uVar105 = sVar63 * sVar46 + sVar99;
    uVar107 = sVar66 * uVar13 + sVar100;
    uVar76 = uVar75 >> 8;
    uVar80 = uVar79 >> 8;
    uVar84 = uVar83 >> 8;
    uVar88 = uVar87 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar109 = sVar57 * uVar31 + sVar91;
    uVar111 = sVar58 * uVar32 + sVar94;
    uVar113 = sVar59 * uVar33 + sVar95;
    uVar115 = sVar60 * uVar34 + sVar96;
    uVar77 = sVar61 * uVar35 + sVar97;
    uVar81 = sVar62 * uVar36 + sVar98;
    uVar85 = sVar63 * uVar37 + sVar99;
    uVar89 = sVar66 * uVar38 + sVar100;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar78 = uVar77 >> 8;
    uVar82 = uVar81 >> 8;
    uVar86 = uVar85 >> 8;
    uVar90 = uVar89 >> 8;
    puVar27[-0x10] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar27[-0xf] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    puVar27[-0xe] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar27[-0xd] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar27[-0xc] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar27[-0xb] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar27[-10] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar27[-9] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar27[-8] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar27[-7] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar27[-6] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar27[-5] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar27[-4] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar27[-3] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
    puVar27[-2] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar27[-1] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    uVar109 = sVar57 * uVar47 + sVar91;
    uVar111 = sVar58 * sVar48 + sVar94;
    uVar113 = sVar59 * sVar49 + sVar95;
    uVar115 = sVar60 * sVar50 + sVar96;
    uVar77 = sVar61 * sVar51 + sVar97;
    uVar81 = sVar62 * sVar52 + sVar98;
    uVar85 = sVar63 * sVar53 + sVar99;
    uVar89 = sVar66 * uVar67 + sVar100;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar78 = uVar77 >> 8;
    uVar82 = uVar81 >> 8;
    uVar86 = uVar85 >> 8;
    uVar90 = uVar89 >> 8;
    uVar75 = sVar57 * uVar39 + sVar91;
    uVar79 = sVar58 * uVar68 + sVar94;
    uVar83 = sVar59 * uVar69 + sVar95;
    uVar87 = sVar60 * uVar70 + sVar96;
    uVar101 = sVar61 * uVar71 + sVar97;
    uVar103 = sVar62 * uVar72 + sVar98;
    uVar105 = sVar63 * uVar73 + sVar99;
    uVar107 = sVar66 * uVar74 + sVar100;
    uVar76 = uVar75 >> 8;
    uVar80 = uVar79 >> 8;
    uVar84 = uVar83 >> 8;
    uVar88 = uVar87 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    *puVar27 = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar27[1] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar27[2] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar27[3] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar27[4] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar27[5] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
    puVar27[6] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar27[7] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    puVar27[8] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar27[9] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    puVar27[10] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar27[0xb] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar27[0xc] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar27[0xd] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar27[0xe] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar27[0xf] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    auVar65 = _DAT_00516ae0;
    puVar27 = puVar27 + stride;
  } while (uVar26 < 0xd0c0d0d);
  uVar26 = 0xfefdfefe;
  do {
    uVar26 = uVar26 + 0x2020202;
    auVar64._4_4_ = uVar26;
    auVar64._0_4_ = uVar26;
    auVar64._8_4_ = uVar26;
    auVar64._12_4_ = uVar26;
    auVar55 = pshufb(auVar65,auVar64);
    auVar93 = pshufb(auVar29,auVar64);
    sVar57 = auVar55._0_2_;
    sVar58 = auVar55._2_2_;
    sVar59 = auVar55._4_2_;
    sVar60 = auVar55._6_2_;
    sVar61 = auVar55._8_2_;
    sVar62 = auVar55._10_2_;
    sVar63 = auVar55._12_2_;
    sVar66 = auVar55._14_2_;
    sVar91 = auVar93._0_2_ + 0x80;
    sVar94 = auVar93._2_2_ + 0x80;
    sVar95 = auVar93._4_2_ + 0x80;
    sVar96 = auVar93._6_2_ + 0x80;
    sVar97 = auVar93._8_2_ + 0x80;
    sVar98 = auVar93._10_2_ + 0x80;
    sVar99 = auVar93._12_2_ + 0x80;
    sVar100 = auVar93._14_2_ + 0x80;
    uVar75 = sVar57 * uVar40 + sVar91;
    uVar79 = sVar58 * sVar41 + sVar94;
    uVar83 = sVar59 * sVar42 + sVar95;
    uVar87 = sVar60 * sVar43 + sVar96;
    uVar101 = sVar61 * sVar44 + sVar97;
    uVar103 = sVar62 * sVar45 + sVar98;
    uVar105 = sVar63 * sVar46 + sVar99;
    uVar107 = sVar66 * uVar13 + sVar100;
    uVar76 = uVar75 >> 8;
    uVar80 = uVar79 >> 8;
    uVar84 = uVar83 >> 8;
    uVar88 = uVar87 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar109 = sVar57 * uVar31 + sVar91;
    uVar111 = sVar58 * uVar32 + sVar94;
    uVar113 = sVar59 * uVar33 + sVar95;
    uVar115 = sVar60 * uVar34 + sVar96;
    uVar77 = sVar61 * uVar35 + sVar97;
    uVar81 = sVar62 * uVar36 + sVar98;
    uVar85 = sVar63 * uVar37 + sVar99;
    uVar89 = sVar66 * uVar38 + sVar100;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar78 = uVar77 >> 8;
    uVar82 = uVar81 >> 8;
    uVar86 = uVar85 >> 8;
    uVar90 = uVar89 >> 8;
    puVar27[-0x10] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar27[-0xf] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    puVar27[-0xe] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar27[-0xd] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar27[-0xc] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar27[-0xb] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar27[-10] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar27[-9] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar27[-8] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar27[-7] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar27[-6] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar27[-5] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar27[-4] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar27[-3] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
    puVar27[-2] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar27[-1] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    uVar109 = sVar57 * uVar47 + sVar91;
    uVar111 = sVar58 * sVar48 + sVar94;
    uVar113 = sVar59 * sVar49 + sVar95;
    uVar115 = sVar60 * sVar50 + sVar96;
    uVar77 = sVar61 * sVar51 + sVar97;
    uVar81 = sVar62 * sVar52 + sVar98;
    uVar85 = sVar63 * sVar53 + sVar99;
    uVar89 = sVar66 * uVar67 + sVar100;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar78 = uVar77 >> 8;
    uVar82 = uVar81 >> 8;
    uVar86 = uVar85 >> 8;
    uVar90 = uVar89 >> 8;
    uVar75 = sVar57 * uVar39 + sVar91;
    uVar79 = sVar58 * uVar68 + sVar94;
    uVar83 = sVar59 * uVar69 + sVar95;
    uVar87 = sVar60 * uVar70 + sVar96;
    uVar101 = sVar61 * uVar71 + sVar97;
    uVar103 = sVar62 * uVar72 + sVar98;
    uVar105 = sVar63 * uVar73 + sVar99;
    uVar107 = sVar66 * uVar74 + sVar100;
    uVar76 = uVar75 >> 8;
    uVar80 = uVar79 >> 8;
    uVar84 = uVar83 >> 8;
    uVar88 = uVar87 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    *puVar27 = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar27[1] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar27[2] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar27[3] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar27[4] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar27[5] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
    puVar27[6] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar27[7] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    puVar27[8] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar27[9] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    puVar27[10] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar27[0xb] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar27[0xc] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar27[0xd] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar27[0xe] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar27[0xf] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    auVar55 = _DAT_00516b00;
    puVar27 = puVar27 + stride;
  } while (uVar26 < 0xd0c0d0d);
  auVar65._0_2_ = sVar28 * 0xeb;
  auVar65._2_2_ = sVar30 * 0xef;
  auVar65._4_2_ = sVar28 * 0xf2;
  auVar65._6_2_ = sVar30 * 0xf4;
  auVar65._8_2_ = sVar28 * 0xf6;
  auVar65._10_2_ = sVar30 * 0xf7;
  auVar65._12_2_ = sVar28 * 0xf8;
  auVar65._14_2_ = sVar30 * 0xf8;
  uVar26 = 0xfefdfefe;
  do {
    uVar26 = uVar26 + 0x2020202;
    auVar56._4_4_ = uVar26;
    auVar56._0_4_ = uVar26;
    auVar56._8_4_ = uVar26;
    auVar56._12_4_ = uVar26;
    auVar93 = pshufb(auVar55,auVar56);
    auVar29 = pshufb(auVar65,auVar56);
    sVar28 = auVar93._0_2_;
    sVar30 = auVar93._2_2_;
    sVar57 = auVar93._4_2_;
    sVar58 = auVar93._6_2_;
    sVar59 = auVar93._8_2_;
    sVar60 = auVar93._10_2_;
    sVar61 = auVar93._12_2_;
    sVar62 = auVar93._14_2_;
    sVar63 = auVar29._0_2_ + 0x80;
    sVar66 = auVar29._2_2_ + 0x80;
    sVar91 = auVar29._4_2_ + 0x80;
    sVar94 = auVar29._6_2_ + 0x80;
    sVar95 = auVar29._8_2_ + 0x80;
    sVar96 = auVar29._10_2_ + 0x80;
    sVar97 = auVar29._12_2_ + 0x80;
    sVar98 = auVar29._14_2_ + 0x80;
    uVar75 = sVar28 * uVar40 + sVar63;
    uVar79 = sVar30 * sVar41 + sVar66;
    uVar83 = sVar57 * sVar42 + sVar91;
    uVar87 = sVar58 * sVar43 + sVar94;
    uVar101 = sVar59 * sVar44 + sVar95;
    uVar103 = sVar60 * sVar45 + sVar96;
    uVar105 = sVar61 * sVar46 + sVar97;
    uVar107 = sVar62 * uVar13 + sVar98;
    uVar76 = uVar75 >> 8;
    uVar80 = uVar79 >> 8;
    uVar84 = uVar83 >> 8;
    uVar88 = uVar87 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar109 = sVar28 * uVar31 + sVar63;
    uVar111 = sVar30 * uVar32 + sVar66;
    uVar113 = sVar57 * uVar33 + sVar91;
    uVar115 = sVar58 * uVar34 + sVar94;
    uVar77 = sVar59 * uVar35 + sVar95;
    uVar81 = sVar60 * uVar36 + sVar96;
    uVar85 = sVar61 * uVar37 + sVar97;
    uVar89 = sVar62 * uVar38 + sVar98;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar78 = uVar77 >> 8;
    uVar82 = uVar81 >> 8;
    uVar86 = uVar85 >> 8;
    uVar90 = uVar89 >> 8;
    puVar27[-0x10] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar27[-0xf] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    puVar27[-0xe] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar27[-0xd] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar27[-0xc] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar27[-0xb] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar27[-10] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar27[-9] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar27[-8] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar27[-7] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar27[-6] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar27[-5] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar27[-4] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar27[-3] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
    puVar27[-2] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar27[-1] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    uVar109 = sVar28 * uVar47 + sVar63;
    uVar111 = sVar30 * sVar48 + sVar66;
    uVar113 = sVar57 * sVar49 + sVar91;
    uVar115 = sVar58 * sVar50 + sVar94;
    uVar77 = sVar59 * sVar51 + sVar95;
    uVar81 = sVar60 * sVar52 + sVar96;
    uVar85 = sVar61 * sVar53 + sVar97;
    uVar89 = sVar62 * uVar67 + sVar98;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar78 = uVar77 >> 8;
    uVar82 = uVar81 >> 8;
    uVar86 = uVar85 >> 8;
    uVar90 = uVar89 >> 8;
    uVar75 = sVar28 * uVar39 + sVar63;
    uVar79 = sVar30 * uVar68 + sVar66;
    uVar83 = sVar57 * uVar69 + sVar91;
    uVar87 = sVar58 * uVar70 + sVar94;
    uVar101 = sVar59 * uVar71 + sVar95;
    uVar103 = sVar60 * uVar72 + sVar96;
    uVar105 = sVar61 * uVar73 + sVar97;
    uVar107 = sVar62 * uVar74 + sVar98;
    uVar76 = uVar75 >> 8;
    uVar80 = uVar79 >> 8;
    uVar84 = uVar83 >> 8;
    uVar88 = uVar87 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    *puVar27 = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar27[1] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar27[2] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar27[3] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar27[4] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar27[5] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
    puVar27[6] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar85 >> 8) - (0xff < uVar86);
    puVar27[7] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    puVar27[8] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar27[9] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    puVar27[10] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar27[0xb] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar88);
    puVar27[0xc] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar27[0xd] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar27[0xe] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar27[0xf] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar27 = puVar27 + stride;
  } while (uVar26 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_v_predictor_32x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i zero = _mm_setzero_si128();
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i top_lo = LoadUnaligned16(top_row);
  const __m128i top_hi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lo, zero);
  const __m128i top3 = cvtepu8_epi16(top_hi);
  const __m128i top4 = _mm_unpackhi_epi8(top_hi, zero);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = _mm_unpackhi_epi8(weights_lo, zero);
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = _mm_unpackhi_epi8(weights_hi, zero);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i scaled_bottom_left3 =
      _mm_mullo_epi16(inverted_weights3, bottom_left);
  const __m128i scaled_bottom_left4 =
      _mm_mullo_epi16(inverted_weights4, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights3, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left3, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights4, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left4, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}